

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O2

ostream * log_info(void)

{
  ostream *poVar1;
  string asStack_28 [32];
  
  if ((int)g_log_level < 3) {
    std::ios::clear((int)*(undefined8 *)(g_sink_stringstream_abi_cxx11_ + -0x18) + 0x20d4f0);
    poVar1 = (ostream *)&DAT_0020d500;
  }
  else {
    get_time_str_abi_cxx11_();
    poVar1 = std::operator<<((ostream *)&std::cout,asStack_28);
    poVar1 = std::operator<<(poVar1," INFO ");
    std::__cxx11::string::~string(asStack_28);
  }
  return poVar1;
}

Assistant:

std::ostream &log_info()
{
  if (g_log_level >= log_level_info)
  {
    return std::cout << get_time_str() << " INFO ";
  }

  g_sink_stringstream.clear();
  return g_sink_stringstream;
}